

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O2

void __thiscall TasGrid::GridSequence::write<true>(GridSequence *this,ostream *os)

{
  IO::writeNumbers<true,(TasGrid::IO::IOPad)1,int,int>
            ((ostream *)os,(this->super_BaseCanonicalGrid).num_dimensions,
             (this->super_BaseCanonicalGrid).num_outputs);
  IO::writeRule<true>(this->rule,(ostream *)os);
  IO::writeFlag<true,(TasGrid::IO::IOPad)4>
            ((this->super_BaseCanonicalGrid).points.indexes.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             != (this->super_BaseCanonicalGrid).points.indexes.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish,(ostream *)os);
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    MultiIndexSet::write<true>(&(this->super_BaseCanonicalGrid).points,(ostream *)os);
  }
  IO::writeFlag<true,(TasGrid::IO::IOPad)4>
            ((this->super_BaseCanonicalGrid).needed.indexes.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             != (this->super_BaseCanonicalGrid).needed.indexes.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish,(ostream *)os);
  if ((this->super_BaseCanonicalGrid).needed.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->super_BaseCanonicalGrid).needed.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    MultiIndexSet::write<true>(&(this->super_BaseCanonicalGrid).needed,(ostream *)os);
  }
  IO::writeFlag<true,(TasGrid::IO::IOPad)4>((this->surpluses).num_strips != 0,(ostream *)os);
  if ((this->surpluses).num_strips != 0) {
    IO::writeVector<true,(TasGrid::IO::IOPad)3,double>(&(this->surpluses).vec,(ostream *)os);
  }
  if (0 < (this->super_BaseCanonicalGrid).num_outputs) {
    StorageSet::write<true>(&(this->super_BaseCanonicalGrid).values,(ostream *)os);
    return;
  }
  return;
}

Assistant:

void GridSequence::write(std::ostream &os) const{
    if (iomode == mode_ascii){ os << std::scientific; os.precision(17); }
    IO::writeNumbers<iomode, IO::pad_rspace>(os, num_dimensions, num_outputs);
    IO::writeRule<iomode>(rule, os);

    IO::writeFlag<iomode, IO::pad_auto>(!points.empty(), os);
    if (!points.empty()) points.write<iomode>(os);
    IO::writeFlag<iomode, IO::pad_auto>(!needed.empty(), os);
    if (!needed.empty()) needed.write<iomode>(os);

    IO::writeFlag<iomode, IO::pad_auto>(!surpluses.empty(), os);
    if (!surpluses.empty()) surpluses.writeVector<iomode, IO::pad_line>(os);

    if (num_outputs > 0) values.write<iomode>(os);
}